

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_builder.c
# Opt level: O0

ChildDefinitions * get_child_definitions(AstNode *ast_node)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ItemQueue *item_queue;
  ItemQueue *item_queue_00;
  Background *pBVar4;
  ChildDefinitions *pCVar5;
  ChildDefinition **ppCVar6;
  ChildDefinition *pCVar7;
  wchar_t local_3c;
  wchar_t i;
  ChildDefinitions *child_definitions;
  wchar_t scenario_count;
  wchar_t background_count;
  Background *background;
  ItemQueue *rule_queue;
  ItemQueue *scenario_definitions_queue;
  AstNode *ast_node_local;
  
  item_queue = AstNode_get_items(ast_node,Rule_ScenarioDefinition);
  item_queue_00 = AstNode_get_items(ast_node,Rule_Rule);
  pBVar4 = get_background(ast_node);
  uVar1 = (uint)(pBVar4 != (Background *)0x0);
  iVar2 = ItemQueue_size(item_queue);
  pCVar5 = (ChildDefinitions *)malloc(0x10);
  iVar3 = ItemQueue_size(item_queue_00);
  pCVar5->child_definition_count = uVar1 + iVar2 + iVar3;
  pCVar5->child_definitions = (ChildDefinition **)0x0;
  if (L'\0' < pCVar5->child_definition_count) {
    ppCVar6 = (ChildDefinition **)malloc((long)pCVar5->child_definition_count << 3);
    pCVar5->child_definitions = ppCVar6;
    local_3c = uVar1;
    if (pBVar4 != (Background *)0x0) {
      *pCVar5->child_definitions = (ChildDefinition *)pBVar4;
    }
    for (; local_3c < (int)(uVar1 + iVar2); local_3c = local_3c + 1) {
      pCVar7 = (ChildDefinition *)ItemQueue_remove(item_queue);
      pCVar5->child_definitions[local_3c] = pCVar7;
    }
    for (local_3c = uVar1 + iVar2; local_3c < pCVar5->child_definition_count;
        local_3c = local_3c + L'\x01') {
      pCVar7 = (ChildDefinition *)ItemQueue_remove(item_queue_00);
      pCVar5->child_definitions[local_3c] = pCVar7;
    }
  }
  return pCVar5;
}

Assistant:

static const ChildDefinitions* get_child_definitions(AstNode* ast_node) {
    ItemQueue* scenario_definitions_queue = AstNode_get_items(ast_node, Rule_ScenarioDefinition);
    ItemQueue* rule_queue = AstNode_get_items(ast_node, Rule_Rule);
    const Background* background = get_background(ast_node);
    int background_count = background ? 1 : 0;
    int scenario_count = ItemQueue_size(scenario_definitions_queue);
    ChildDefinitions* child_definitions = (ChildDefinitions*)malloc(sizeof(ChildDefinitions));
    child_definitions->child_definition_count = background_count + scenario_count + ItemQueue_size(rule_queue);
    child_definitions->child_definitions = 0;
    if (child_definitions->child_definition_count > 0) {
        child_definitions->child_definitions = (ChildDefinition**)malloc(child_definitions->child_definition_count * sizeof(ChildDefinition*));
        int i;
        if (background) {
            child_definitions->child_definitions[0] = (ChildDefinition*)background;
        }
        for (i = background_count; i < background_count + scenario_count; ++i) {
            child_definitions->child_definitions[i] = (ChildDefinition*)ItemQueue_remove(scenario_definitions_queue);
        }
        for (i = background_count + scenario_count; i < child_definitions->child_definition_count; ++i) {
            child_definitions->child_definitions[i] = (ChildDefinition*)ItemQueue_remove(rule_queue);
        }
    }
    return child_definitions;
}